

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall
slang::ast::Scope::addWildcardImport
          (Scope *this,PackageImportItemSyntax *item,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes)

{
  WildcardImportData *pWVar1;
  pointer ppWVar2;
  Compilation *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  SourceLocation location;
  Diagnostic *this_01;
  WildcardImportSymbol *pWVar4;
  pointer ppWVar5;
  string_view __y;
  SourceLocation local_48;
  string_view local_40;
  
  pWVar1 = this->importData;
  if (pWVar1 == (WildcardImportData *)0x0) {
LAB_003d33e7:
    this_00 = this->compilation;
    local_40 = parsing::Token::valueText(&item->package);
    local_48 = parsing::Token::location(&item->item);
    pWVar4 = BumpAllocator::
             emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&this_00->super_BumpAllocator,&local_40,&local_48);
    (pWVar4->super_Symbol).originatingSyntax = &item->super_SyntaxNode;
    Symbol::setAttributes(&pWVar4->super_Symbol,this,attributes);
    addMember(this,&pWVar4->super_Symbol);
    addWildcardImport(this,pWVar4);
  }
  else {
    ppWVar5 = (pWVar1->wildcardImports).
              super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppWVar2 = (pWVar1->wildcardImports).
              super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (ppWVar5 == ppWVar2) goto LAB_003d33e7;
      pWVar4 = *ppWVar5;
      __x._M_len = (pWVar4->packageName)._M_len;
      __x._M_str = (pWVar4->packageName)._M_str;
      __y = parsing::Token::valueText(&item->package);
      bVar3 = std::operator==(__x,__y);
      ppWVar5 = ppWVar5 + 1;
    } while (!bVar3);
    if ((pWVar4->packageName)._M_len != 0) {
      location = parsing::Token::location(&item->item);
      this_01 = addDiag(this,(DiagCode)0x41000a,location);
      Diagnostic::addNote(this_01,(DiagCode)0xa0001,(pWVar4->super_Symbol).location);
      return;
    }
  }
  return;
}

Assistant:

void Scope::addWildcardImport(const PackageImportItemSyntax& item,
                              std::span<const AttributeInstanceSyntax* const> attributes) {
    if (importData) {
        // Check for redundant import statements.
        for (auto import : importData->wildcardImports) {
            if (import->packageName == item.package.valueText()) {
                if (!import->packageName.empty()) {
                    auto& diag = addDiag(diag::DuplicateImport, item.item.location());
                    diag.addNote(diag::NotePreviousDefinition, import->location);
                }
                return;
            }
        }
    }

    auto import = compilation.emplace<WildcardImportSymbol>(item.package.valueText(),
                                                            item.item.location());

    import->setSyntax(item);
    import->setAttributes(*this, attributes);
    addMember(*import);
    addWildcardImport(*import);
}